

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
cs::compiler_type::gen_tree
          (compiler_type *this,tree_type<cs::token_base_*> *tree,
          deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *raw)

{
  bool bVar1;
  int iVar2;
  size_type sVar3;
  reference pptVar4;
  void *pvVar5;
  tree_type<cs::token_base_*> *this_00;
  tree_type<cs::token_base_*> *in_RDX;
  compiler_type *in_RSI;
  undefined8 in_RDI;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> objects;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> signals;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_000000d8;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_000000e0;
  tree_type<cs::token_base_*> *in_stack_000000e8;
  tree_type<cs::token_base_*> t;
  token_base **it;
  iterator __end4;
  iterator __begin4;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *__range4;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *list;
  iterator __end3;
  iterator __begin3;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *__range3;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> tokens;
  token_sblist *sbl;
  token_base *obj;
  _Self *in_stack_fffffffffffffdd8;
  _Self *in_stack_fffffffffffffde0;
  tree_type<cs::token_base_*> *this_01;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffdf0;
  token_expr *this_02;
  optm_type do_optm;
  tree_type<cs::token_base_*> *in_stack_fffffffffffffe08;
  compiler_type *in_stack_fffffffffffffe10;
  signal_types in_stack_fffffffffffffe2c;
  token_signal *in_stack_fffffffffffffe30;
  token_base **in_stack_fffffffffffffe38;
  tree_type<cs::token_base_*> *in_stack_fffffffffffffe40;
  iterator in_stack_fffffffffffffe48;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffe88;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffe90;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffe98;
  compiler_type *in_stack_fffffffffffffea0;
  tree_type<cs::token_base_*> local_138;
  void *local_130;
  reference local_118;
  _Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> local_f0;
  reference local_d0;
  reference local_c8;
  _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
  local_a0;
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  *local_80;
  token_expr local_78 [3];
  token_sblist *local_28;
  token_sblist *raw_00;
  
  tree_type<cs::token_base_*>::clear((tree_type<cs::token_base_*> *)in_stack_fffffffffffffde0);
  sVar3 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::size
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5cbc16);
  do_optm = (optm_type)((ulong)in_RDI >> 0x20);
  if (sVar3 == 1) {
    pptVar4 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::front
                        (in_stack_fffffffffffffdf0);
    do_optm = (optm_type)((ulong)in_RDI >> 0x20);
    raw_00 = (token_sblist *)*pptVar4;
    if (raw_00 != (token_sblist *)0x0) {
      iVar2 = (*(raw_00->super_token_base)._vptr_token_base[2])();
      do_optm = (optm_type)((ulong)in_RDI >> 0x20);
      if (iVar2 == 9) {
        local_28 = raw_00;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5cbc7b);
        local_80 = token_sblist::get_list(local_28);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::begin((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
                 *)in_stack_fffffffffffffdd8);
        std::
        deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
        ::end((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
               *)in_stack_fffffffffffffdd8);
        while( true ) {
          bVar1 = std::operator!=(in_stack_fffffffffffffde0,in_stack_fffffffffffffdd8);
          do_optm = (optm_type)((ulong)in_RDI >> 0x20);
          if (!bVar1) break;
          local_d0 = std::
                     _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
                     ::operator*(&local_a0);
          local_c8 = local_d0;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::begin
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffffdd8);
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::end
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffffdd8);
          while( true ) {
            bVar1 = std::operator!=((_Self *)in_stack_fffffffffffffde0,
                                    (_Self *)in_stack_fffffffffffffdd8);
            if (!bVar1) break;
            local_118 = std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>
                        ::operator*(&local_f0);
            std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
            std::_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**>::operator++
                      ((_Deque_iterator<cs::token_base_*,_cs::token_base_*&,_cs::token_base_**> *)
                       in_stack_fffffffffffffde0);
          }
          pvVar5 = token_base::operator_new((size_t)in_stack_fffffffffffffde0);
          token_signal::token_signal(in_stack_fffffffffffffe30,in_stack_fffffffffffffe2c);
          local_130 = pvVar5;
          std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::push_back
                    ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                     in_stack_fffffffffffffde0,(value_type *)in_stack_fffffffffffffdd8);
          std::
          _Deque_iterator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_&,_std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_*>
          ::operator++(in_stack_fffffffffffffde0);
        }
        this_02 = local_78;
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::pop_back
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffde0);
        this_01 = &local_138;
        tree_type<cs::token_base_*>::tree_type(this_01);
        gen_tree(in_RSI,in_RDX,(deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)raw_00)
        ;
        this_00 = (tree_type<cs::token_base_*> *)
                  token_base::operator_new((size_t)in_stack_fffffffffffffde0);
        tree_type<cs::token_base_*>::tree_type
                  (this_00,(tree_type<cs::token_base_*> *)in_stack_fffffffffffffdd8);
        token_expr::token_expr(this_02,this_01);
        tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x5cbeb5);
        tree_type<cs::token_base_*>::~tree_type((tree_type<cs::token_base_*> *)0x5cbec2);
        std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
                  ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                   in_stack_fffffffffffffe30);
      }
    }
    tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_RSI);
    tree_type<cs::token_base*>::emplace_root_left<cs::token_base*&>
              (in_stack_fffffffffffffe40,in_stack_fffffffffffffe48,in_stack_fffffffffffffe38);
  }
  else {
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5cbfac);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)0x5cbfb6);
    split_token(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,in_stack_fffffffffffffe90,
                in_stack_fffffffffffffe88);
    build_tree((compiler_type *)t.mRoot,in_stack_000000e8,in_stack_000000e0,in_stack_000000d8);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
               in_stack_fffffffffffffe30);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::~deque
              ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
               in_stack_fffffffffffffe30);
  }
  optimize_expression(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08,do_optm);
  return;
}

Assistant:

void compiler_type::gen_tree(tree_type<token_base *> &tree, std::deque<token_base *> &raw)
	{
		tree.clear();
		if (raw.size() == 1) {
			token_base *obj = raw.front();
			if (obj != nullptr && obj->get_type() == token_types::sblist) {
				auto *sbl = static_cast<token_sblist *>(obj);
				std::deque<token_base *> tokens;
				for (auto &list: sbl->get_list()) {
					for (auto &it: list)
						tokens.push_back(it);
					tokens.push_back(new token_signal(signal_types::com_));
				}
				tokens.pop_back();
				tree_type<token_base *> t;
				gen_tree(t, tokens);
				obj = new token_expr(t);
			}
			tree.emplace_root_left(tree.root(), obj);
		}
		else {
			std::deque<token_base *> signals, objects;
			split_token(raw, signals, objects);
			build_tree(tree, signals, objects);
		}
		optimize_expression(tree);
	}